

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall
QMdiAreaPrivate::scrollBarPolicyChanged
          (QMdiAreaPrivate *this,Orientation orientation,ScrollBarPolicy policy)

{
  long lVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  QMdiSubWindow *child;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->childWindows).d.size;
  if (lVar1 != 0) {
    local_50.d = (this->childWindows).d.d;
    pQVar2 = (this->childWindows).d.ptr;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.ptr = pQVar2;
    local_50.size = lVar1;
    for (lVar5 = 0; lVar1 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
      lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar5);
      if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
        child = (QMdiSubWindow *)0x0;
      }
      else {
        child = *(QMdiSubWindow **)((long)&(pQVar2->wp).value + lVar5);
      }
      bVar4 = sanityCheck(child,"QMdiArea::scrollBarPolicyChanged");
      if (bVar4) {
        QMdiSubWindow::setOption
                  (child,(orientation != Horizontal) + AllowOutsideAreaHorizontally,
                   policy != ScrollBarAlwaysOff);
      }
    }
    updateScrollBars(this);
    QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::scrollBarPolicyChanged(Qt::Orientation orientation, Qt::ScrollBarPolicy policy)
{
    if (childWindows.isEmpty())
        return;

    const QMdiSubWindow::SubWindowOption option = orientation == Qt::Horizontal ?
        QMdiSubWindow::AllowOutsideAreaHorizontally : QMdiSubWindow::AllowOutsideAreaVertically;
    const bool enable = policy != Qt::ScrollBarAlwaysOff;
    // Take a copy because child->setOption() may indirectly call QCoreApplication::sendEvent(),
    // the latter could call unknown code that could e.g. recurse into the class
    // modifying childWindows.
    const auto subWindows = childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::scrollBarPolicyChanged"))
            continue;
        child->setOption(option, enable);
    }
    updateScrollBars();
}